

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O1

TA_RetCode TA_FuncTableAlloc(char *group,TA_StringTable **table)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  TA_StringTable *table_00;
  char **__s;
  ulong uVar3;
  long lVar4;
  TA_RetCode TVar5;
  
  if (table == (TA_StringTable **)0x0 || group == (char *)0x0) {
    return TA_BAD_PARAM;
  }
  *table = (TA_StringTable *)0x0;
  TVar5 = TA_SUCCESS;
  lVar4 = 0;
  do {
    iVar2 = strcmp(TA_GroupString[lVar4],group);
    if (iVar2 == 0) goto LAB_0013cfb9;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  TVar5 = TA_GROUP_NOT_FOUND;
  lVar4 = 0;
LAB_0013cfb9:
  if (iVar2 != 0) {
    return TVar5;
  }
  uVar1 = TA_PerGroupSize[lVar4];
  table_00 = (TA_StringTable *)malloc(0x1c);
  if (table_00 == (TA_StringTable *)0x0) {
    *table = (TA_StringTable *)0x0;
LAB_0013d06e:
    TVar5 = TA_ALLOC_ERR;
  }
  else {
    *(undefined8 *)((long)&table_00->string + 4) = 0;
    *(undefined8 *)((long)&table_00->hiddenData + 4) = 0;
    *(undefined8 *)table_00 = 0;
    table_00->string = (char **)0x0;
    table_00[1].size = 0xa20cb20c;
    table_00->hiddenData = table_00 + 1;
    table_00->size = uVar1;
    if (uVar1 != 0) {
      __size = (ulong)uVar1 * 8;
      __s = (char **)malloc(__size);
      table_00->string = __s;
      if (__s == (char **)0x0) {
        *table = (TA_StringTable *)0x0;
        TA_FuncTableFree(table_00);
        goto LAB_0013d06e;
      }
      uVar3 = 0;
      memset(__s,0,__size);
      do {
        table_00->string[uVar3] = TA_PerGroupFuncDef[lVar4][uVar3]->funcInfo->name;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    *table = table_00;
    TVar5 = TA_SUCCESS;
  }
  return TVar5;
}

Assistant:

TA_RetCode TA_FuncTableAlloc( const char *group, TA_StringTable **table )
{
   TA_RetCode retCode;
   unsigned int i;
   TA_StringTable *stringTable;
   unsigned int groupId; /* TA_GroupId */
   unsigned int groupSize;
   const char *stringPtr;
   TA_StringTablePriv *stringTablePriv;

   if( (group == NULL) || (table == NULL ) )
   {
      return TA_BAD_PARAM;
   }

   *table = NULL;
   stringPtr = NULL;

   /* Get information on the group. */
   retCode = getGroupId( group, &groupId );
   if( retCode != TA_SUCCESS )
   {
      return retCode;
   }

   retCode = getGroupSize( (TA_GroupId)groupId, &groupSize );
   if( retCode != TA_SUCCESS )
   {
      return retCode;
   }

   /* Allocate the table. */

   stringTable = (TA_StringTable *)TA_Malloc( sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   if( !stringTable )
   {
      *table = NULL;
      return TA_ALLOC_ERR;
   }

   memset( stringTable, 0, sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   stringTablePriv = (TA_StringTablePriv *)(((char *)stringTable)+sizeof(TA_StringTable));
   stringTablePriv->magicNumber = TA_STRING_TABLE_FUNC_MAGIC_NB;
   stringTable->hiddenData = stringTablePriv;

   /* From this point, TA_FuncTableFree can be safely called. */
   stringTable->size = groupSize;
   if( groupSize != 0 )
   {
      stringTable->string = (const char **)TA_Malloc( (stringTable->size) *
                                                      sizeof(const char *) );

      if( stringTable->string == NULL )
      {
         *table = NULL;
         TA_FuncTableFree( stringTable );
         return TA_ALLOC_ERR;
      }

      memset( (void *)stringTable->string, 0,
              (stringTable->size) * sizeof(const char *) );

      for( i=0; i < stringTable->size; i++ )
      {
         retCode = getFuncNameByIdx( (TA_GroupId)groupId, i, &stringPtr );

         if( retCode != TA_SUCCESS )
         {
            *table = NULL;
            TA_FuncTableFree( stringTable );
            return TA_ALLOC_ERR;
         }

         (stringTable->string)[i] = stringPtr;
      }
   }

   /* Return the table to the caller. */
   *table = stringTable;

   return TA_SUCCESS;
}